

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O0

bool __thiscall LEFReader::parseRect(LEFReader *this)

{
  token_t tVar1;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  undefined4 local_78;
  allocator<char> local_71;
  string local_70;
  uint local_3c;
  string local_38 [4];
  uint32_t i;
  string coords;
  LEFReader *this_local;
  
  coords.field_2._8_8_ = this;
  std::__cxx11::string::string(local_38);
  local_3c = 0;
  do {
    if (3 < local_3c) {
      tVar1 = tokenize(this,&this->m_tokstr);
      this->m_curtok = tVar1;
      if (this->m_curtok == TOK_SEMICOL) {
        tVar1 = tokenize(this,&this->m_tokstr);
        this->m_curtok = tVar1;
        if (this->m_curtok == TOK_EOL) {
          this_local._7_1_ = true;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,"Expected an EOL in RECT\n",&local_c1);
          error(this,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::allocator<char>::~allocator(&local_c1);
          this_local._7_1_ = false;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"Expected a semicolon in RECT\n",&local_99);
        error(this,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator(&local_99);
        this_local._7_1_ = false;
      }
LAB_0016cde5:
      local_78 = 1;
      std::__cxx11::string::~string(local_38);
      return this_local._7_1_;
    }
    tVar1 = tokenize(this,&this->m_tokstr);
    this->m_curtok = tVar1;
    if (this->m_curtok != TOK_NUMBER) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Expected number in RECT\n",&local_71);
      error(this,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
      this_local._7_1_ = false;
      goto LAB_0016cde5;
    }
    std::__cxx11::string::operator+=(local_38,(string *)&this->m_tokstr);
    std::__cxx11::string::operator+=(local_38," ");
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

bool LEFReader::parseRect()
{
    
    std::string coords;

    for(uint32_t i=0; i<4; i++)
    {
        m_curtok = tokenize(m_tokstr);
        if (m_curtok != TOK_NUMBER)
        {
            error("Expected number in RECT\n");
            return false;
        }
        coords += m_tokstr;
        coords += " ";
    }

    // expect ; 
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_SEMICOL)
    {
        error("Expected a semicolon in RECT\n");
        return false;
    }

    // expect EOL
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_EOL)
    {
        error("Expected an EOL in RECT\n");
        return false;
    }    

    //std::cout << "      RECT " << coords << "\n";

    return true;
}